

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

optional<common::PSBTError> __thiscall
wallet::CWallet::FillPSBT
          (CWallet *this,PartiallySignedTransaction *psbtx,bool *complete,int sighash_type,bool sign
          ,bool bip32derivs,size_t *n_signed,bool finalize)

{
  long lVar1;
  pointer pPVar2;
  PartiallySignedTransaction psbt;
  bool bVar3;
  const_iterator cVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  PSBTInput *input;
  uint256 *txhash;
  pointer pCVar8;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint uVar9;
  long in_FS_OFFSET;
  undefined8 uStack_2d8;
  ulong local_2d0;
  int n_signed_this_spkm;
  int sighash_type_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  PartiallySignedTransaction local_298;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_190;
  PrecomputedTransactionData txdata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (n_signed != (size_t *)0x0) {
    *n_signed = 0;
  }
  criticalblock47.super_unique_lock._M_device = &(this->cs_wallet).super_recursive_mutex;
  criticalblock47.super_unique_lock._M_owns = false;
  sighash_type_local = sighash_type;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock47.super_unique_lock);
  pCVar8 = *(pointer *)
            &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
  if (*(pointer *)
       ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) !=
      pCVar8) {
    uVar9 = 1;
    uVar5 = 0;
    do {
      pPVar2 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) *
              -0x70a3d70a3d70a3d7;
      if (uVar7 < uVar5 || uVar7 - uVar5 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar6 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar5);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock47.super_unique_lock);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar6);
          }
        }
        goto LAB_00c32600;
      }
      input = pPVar2 + uVar5;
      bVar3 = PSBTInputSigned(input);
      if (((!bVar3) &&
          ((input->non_witness_utxo).
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0)) &&
         (cVar4 = std::
                  _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->mapWallet)._M_h,(key_type *)(pCVar8 + uVar5)),
         cVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
         != (__node_type *)0x0)) {
        (input->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(element_type **)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(input->non_witness_utxo).
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1c8));
      }
      uVar5 = (ulong)uVar9;
      pCVar8 = *(pointer *)
                &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
      uVar7 = ((long)*(pointer *)
                      ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin + 8) - (long)pCVar8 >> 3) * 0x4ec4ec4ec4ec4ec5;
      uVar9 = uVar9 + 1;
    } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
  }
  PrecomputePSBTData(&txdata,psbtx);
  GetAllScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_190,this);
  if ((_Rb_tree_header *)local_190._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_190._M_impl.super__Rb_tree_header) {
    uVar5 = 0;
    local_2d0 = 0;
  }
  else {
    do {
      n_signed_this_spkm = 0;
      uVar5 = (**(code **)(**(long **)(local_190._M_impl.super__Rb_tree_header._M_header._M_left + 1
                                      ) + 200))
                        (*(long **)(local_190._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                         psbtx,&txdata,sighash_type_local,sign,bip32derivs,&n_signed_this_spkm,
                         finalize);
      if ((uVar5 >> 0x20 & 1) != 0) {
        local_2d0 = uVar5 >> 0x28;
        std::
        _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~_Rb_tree(&local_190);
        uVar7 = uVar5 & 0xff00000000;
        goto LAB_00c324f4;
      }
      if (n_signed != (size_t *)0x0) {
        *n_signed = *n_signed + (long)n_signed_this_spkm;
      }
      local_190._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_190._M_impl.super__Rb_tree_header._M_header._M_left);
    } while ((_Rb_tree_header *)local_190._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_190._M_impl.super__Rb_tree_header);
    local_2d0 = uVar5 >> 0x28;
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_190);
  RemoveUnnecessaryTransactions(psbtx,&sighash_type_local);
  *complete = true;
  if ((psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      PartiallySignedTransaction::PartiallySignedTransaction(&local_298,psbtx);
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_2d0;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)uStack_2d8;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._16_4_ =
           (int)CONCAT71(in_register_00000081,sign);
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._20_4_ =
           (int)CONCAT71(in_register_00000089,bip32derivs);
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)this;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)complete;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._40_4_ = n_signed_this_spkm;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._44_4_ = sighash_type_local;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._48_8_ =
           criticalblock47.super_unique_lock._M_device;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_engaged =
           criticalblock47.super_unique_lock._M_owns;
      psbt._57_207_ = stack0xfffffffffffffd61;
      bVar3 = PSBTInputSignedAndVerified
                        (psbt,(uint)&local_298,(PrecomputedTransactionData *)(uVar7 & 0xffffffff));
      *complete = (bool)(*complete & bVar3);
      std::
      _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
      ::~_Rb_tree(&local_298.m_proprietary._M_t);
      std::
      _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~_Rb_tree(&local_298.unknown._M_t);
      std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&local_298.outputs);
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&local_298.inputs);
      std::
      _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
      ::~_Rb_tree(&local_298.m_xpubs._M_t);
      std::_Optional_payload_base<CMutableTransaction>::_M_reset
                ((_Optional_payload_base<CMutableTransaction> *)&local_298);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)(psbtx->inputs).
                                    super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(psbtx->inputs).
                                    super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x70a3d70a3d70a3d7));
  }
  uVar7 = 0;
LAB_00c324f4:
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock47.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<common::PSBTError>)(uVar5 & 0xffffffff | local_2d0 << 0x28 | uVar7);
  }
LAB_00c32600:
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> CWallet::FillPSBT(PartiallySignedTransaction& psbtx, bool& complete, int sighash_type, bool sign, bool bip32derivs, size_t * n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    LOCK(cs_wallet);
    // Get all of the previous transactions
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // If we have no utxo, grab it from the wallet.
        if (!input.non_witness_utxo) {
            const uint256& txhash = txin.prevout.hash;
            const auto it = mapWallet.find(txhash);
            if (it != mapWallet.end()) {
                const CWalletTx& wtx = it->second;
                // We only need the non_witness_utxo, which is a superset of the witness_utxo.
                //   The signing code will switch to the smaller witness_utxo if this is ok.
                input.non_witness_utxo = wtx.tx;
            }
        }
    }

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    // Fill in information from ScriptPubKeyMans
    for (ScriptPubKeyMan* spk_man : GetAllScriptPubKeyMans()) {
        int n_signed_this_spkm = 0;
        const auto error{spk_man->FillPSBT(psbtx, txdata, sighash_type, sign, bip32derivs, &n_signed_this_spkm, finalize)};
        if (error) {
            return error;
        }

        if (n_signed) {
            (*n_signed) += n_signed_this_spkm;
        }
    }

    RemoveUnnecessaryTransactions(psbtx, sighash_type);

    // Complete if every input is now signed
    complete = true;
    for (size_t i = 0; i < psbtx.inputs.size(); ++i) {
        complete &= PSBTInputSignedAndVerified(psbtx, i, &txdata);
    }

    return {};
}